

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_to_dfa.cpp
# Opt level: O1

DFA * __thiscall
RegexToDFAConverter::convert(DFA *__return_storage_ptr__,RegexToDFAConverter *this,string *expr)

{
  map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  *pmVar1;
  _Rb_tree_header *p_Var2;
  char letter;
  int from;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var3;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var4;
  pointer pcVar5;
  iterator iVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  long lVar7;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_iordachebogdan[P]RegexToDFAConverter_regex_to_dfa_cpp:24:15)>
  __comp;
  SyntaxTreeNode *this_00;
  ulong uVar8;
  mapped_type *pmVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var10;
  pointer piVar11;
  _Base_ptr p_Var12;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this_01;
  _Hash_node_base *p_Var13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  long lVar14;
  long lVar15;
  DFA *res;
  int it;
  vector<int,_std::allocator<int>_> next;
  int it_1;
  int curr_pos;
  queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  que;
  string simplified_expr;
  vector<int,_std::allocator<int>_> local_118;
  int local_100;
  int local_ec;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_e8;
  iterator iStack_e0;
  int *local_d8;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_iordachebogdan[P]RegexToDFAConverter_regex_to_dfa_cpp:24:15)>
  local_d0;
  int local_c8 [2];
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_c0;
  map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  *local_b8;
  long local_b0;
  _Deque_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_a8;
  string local_50;
  
  simplify(&local_50,this,expr);
  local_c8[1] = 0;
  this->leaves_count_ = 0;
  p_Var3 = &((this->follow_pos_).
             super__Vector_base<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_h;
  p_Var4 = &((this->follow_pos_).
             super__Vector_base<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_h;
  this_01 = p_Var3;
  if (p_Var4 != p_Var3) {
    do {
      std::
      _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != p_Var4);
    (this->follow_pos_).
    super__Vector_base<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var3;
  }
  pcVar5 = (this->what_letter_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->what_letter_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar5) {
    (this->what_letter_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar5;
  }
  this_00 = expression_eval(this,&local_50,local_c8 + 1);
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_initialize_map(&local_a8,0);
  local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  deque<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>::
  emplace_back<std::vector<int,std::allocator<int>>>
            ((deque<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
              *)&local_a8,&local_118);
  if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  p_Var13 = (this_00->first_pos)._M_h._M_before_begin._M_nxt;
  if (p_Var13 != (_Hash_node_base *)0x0) {
    do {
      local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,*(int *)&p_Var13[1]._M_nxt
                                  );
      iVar6._M_current =
           *(int **)((long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur + 8);
      if (iVar6._M_current ==
          *(int **)((long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)
                   local_a8._M_impl.super__Deque_impl_data._M_start._M_cur,iVar6,(int *)&local_118);
      }
      else {
        *iVar6._M_current = *(int *)&p_Var13[1]._M_nxt;
        *(int **)((long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur + 8) =
             iVar6._M_current + 1;
      }
      p_Var13 = p_Var13->_M_nxt;
    } while (p_Var13 != (_Hash_node_base *)0x0);
  }
  _Var10._M_current = *(int **)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur;
  __last._M_current = *(int **)((long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur + 8);
  if (_Var10._M_current != __last._M_current) {
    uVar8 = (long)__last._M_current - (long)_Var10._M_current >> 2;
    lVar14 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<RegexToDFAConverter::convert(std::__cxx11::string_const&)::__0>>
              (_Var10,__last,(ulong)(((uint)lVar14 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_iordachebogdan[P]RegexToDFAConverter_regex_to_dfa_cpp:24:15)>
                )this);
    if ((long)__last._M_current - (long)_Var10._M_current < 0x41) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<RegexToDFAConverter::convert(std::__cxx11::string_const&)::__0>>
                (_Var10,__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_iordachebogdan[P]RegexToDFAConverter_regex_to_dfa_cpp:24:15)>
                  )this);
    }
    else {
      __last_00._M_current = _Var10._M_current + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<RegexToDFAConverter::convert(std::__cxx11::string_const&)::__0>>
                (_Var10,__last_00,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_iordachebogdan[P]RegexToDFAConverter_regex_to_dfa_cpp:24:15)>
                  )this);
      for (; __last_00._M_current != __last._M_current;
          __last_00._M_current = __last_00._M_current + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<RegexToDFAConverter::convert(std::__cxx11::string_const&)::__0>>
                  (__last_00,
                   (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_iordachebogdan[P]RegexToDFAConverter_regex_to_dfa_cpp:24:15)>
                    )this);
      }
    }
  }
  pmVar1 = &this->mark_;
  std::
  _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::clear(&pmVar1->_M_t);
  __return_storage_ptr__->_vptr_DFA = (_func_int **)&PTR__DFA_00109d90;
  (__return_storage_ptr__->nodes_)._M_h._M_buckets =
       &(__return_storage_ptr__->nodes_)._M_h._M_single_bucket;
  (__return_storage_ptr__->nodes_)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->nodes_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->nodes_)._M_h._M_element_count = 0;
  (__return_storage_ptr__->nodes_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->nodes_)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->nodes_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->final_nodes_)._M_h._M_buckets =
       &(__return_storage_ptr__->final_nodes_)._M_h._M_single_bucket;
  (__return_storage_ptr__->final_nodes_)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->final_nodes_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->final_nodes_)._M_h._M_element_count = 0;
  (__return_storage_ptr__->final_nodes_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->final_nodes_)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->final_nodes_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var2 = &(__return_storage_ptr__->transitions_)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->transitions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->transitions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->transitions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (__return_storage_ptr__->transitions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (__return_storage_ptr__->transitions_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pmVar9 = std::
           map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
           ::operator[](pmVar1,local_a8._M_impl.super__Deque_impl_data._M_start._M_cur);
  *pmVar9 = 1;
  DFA::add_node(__return_storage_ptr__,1);
  DFA::set_initial(__return_storage_ptr__,1);
  SyntaxTreeNode::~SyntaxTreeNode(this_00);
  operator_delete(this_00);
  if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_ec = 1;
    local_d0._M_comp.this = (anon_class_8_1_8991fb9c)(anon_class_8_1_8991fb9c)this;
    local_b8 = pmVar1;
    do {
      std::vector<int,_std::allocator<int>_>::vector
                (&local_118,local_a8._M_impl.super__Deque_impl_data._M_start._M_cur);
      std::
      deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::pop_front((deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)&local_a8);
      if (0 < (int)((ulong)((long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2)) {
        lVar14 = 0;
        do {
          local_e8._M_current = (int *)0x0;
          iStack_e0._M_current = (int *)0x0;
          local_d8 = (int *)0x0;
          lVar15 = (long)(int)lVar14;
          lVar7 = lVar15;
          if ((int)lVar14 <
              (int)((ulong)((long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2)) {
            do {
              lVar14 = lVar7;
              pcVar5 = (this->what_letter_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if (pcVar5[local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar15]] !=
                  pcVar5[local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar14]]) break;
              for (p_Var13 = (this->follow_pos_).
                             super__Vector_base<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start
                             [local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar14]]._M_h._M_before_begin._M_nxt;
                  p_Var13 != (_Hash_node_base *)0x0; p_Var13 = p_Var13->_M_nxt) {
                local_c8[0] = *(int *)&p_Var13[1]._M_nxt;
                if (iStack_e0._M_current == local_d8) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&local_e8,iStack_e0,local_c8);
                }
                else {
                  *iStack_e0._M_current = local_c8[0];
                  iStack_e0._M_current = iStack_e0._M_current + 1;
                }
              }
              lVar14 = lVar14 + 1;
              lVar7 = lVar14;
            } while (lVar14 < (int)((ulong)((long)local_118.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_118.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2));
          }
          iVar6._M_current = iStack_e0._M_current;
          _Var10._M_current = local_e8._M_current;
          if ((this->what_letter_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start
              [local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar15]] != '#') {
            local_b0 = lVar15;
            if (local_e8._M_current != iStack_e0._M_current) {
              uVar8 = (long)iStack_e0._M_current - (long)local_e8._M_current >> 2;
              lVar7 = 0x3f;
              if (uVar8 != 0) {
                for (; uVar8 >> lVar7 == 0; lVar7 = lVar7 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (local_e8._M_current,iStack_e0._M_current,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (_Var10._M_current,iVar6._M_current);
            }
            _Var10 = std::
                     __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                               (local_e8._M_current,iStack_e0._M_current);
            __comp._M_comp.this = local_d0._M_comp.this;
            if ((_Var10._M_current != iStack_e0._M_current) &&
               (iStack_e0._M_current != _Var10._M_current)) {
              iStack_e0._M_current = _Var10._M_current;
            }
            iVar6._M_current = iStack_e0._M_current;
            if (local_e8._M_current != iStack_e0._M_current) {
              lVar15 = (long)iStack_e0._M_current - (long)local_e8._M_current;
              uVar8 = lVar15 >> 2;
              lVar7 = 0x3f;
              if (uVar8 != 0) {
                for (; uVar8 >> lVar7 == 0; lVar7 = lVar7 + -1) {
                }
              }
              local_c0._M_current = local_e8._M_current;
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<RegexToDFAConverter::convert(std::__cxx11::string_const&)::__0>>
                        (local_e8,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  )iStack_e0._M_current,(ulong)(((uint)lVar7 ^ 0x3f) * 2) ^ 0x7e,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_iordachebogdan[P]RegexToDFAConverter_regex_to_dfa_cpp:24:15)>
                          )local_d0._M_comp.this);
              if (lVar15 < 0x41) {
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<RegexToDFAConverter::convert(std::__cxx11::string_const&)::__0>>
                          (local_c0,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     )iVar6._M_current,
                           (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_iordachebogdan[P]RegexToDFAConverter_regex_to_dfa_cpp:24:15)>
                            )__comp._M_comp.this);
              }
              else {
                _Var10._M_current = local_c0._M_current + 0x10;
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<RegexToDFAConverter::convert(std::__cxx11::string_const&)::__0>>
                          (local_c0,_Var10,
                           (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_iordachebogdan[P]RegexToDFAConverter_regex_to_dfa_cpp:24:15)>
                            )__comp._M_comp.this);
                for (; _Var10._M_current != iVar6._M_current;
                    _Var10._M_current = _Var10._M_current + 1) {
                  std::
                  __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<RegexToDFAConverter::convert(std::__cxx11::string_const&)::__0>>
                            (_Var10,__comp);
                }
              }
            }
            pmVar1 = local_b8;
            pmVar9 = std::
                     map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                     ::operator[](local_b8,(key_type *)&local_e8);
            if (*pmVar9 == 0) {
              pmVar9 = std::
                       map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                       ::operator[](pmVar1,(key_type *)&local_e8);
              local_ec = local_ec + 1;
              *pmVar9 = local_ec;
              DFA::add_node(__return_storage_ptr__,local_ec);
              std::
              deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::push_back((deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)&local_a8,(value_type *)&local_e8);
            }
            pmVar9 = std::
                     map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                     ::operator[](pmVar1,&local_118);
            from = *pmVar9;
            letter = (((vector<char,_std::allocator<char>_> *)((long)local_d0._M_comp.this + 0x28))
                     ->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start
                     [local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[local_b0]];
            pmVar9 = std::
                     map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                     ::operator[](pmVar1,(key_type *)&local_e8);
            DFA::add_transition(__return_storage_ptr__,from,letter,*pmVar9);
          }
          if (local_e8._M_current != (int *)0x0) {
            operator_delete(local_e8._M_current);
          }
          this = (RegexToDFAConverter *)local_d0;
        } while ((int)lVar14 <
                 (int)((ulong)((long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                              (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2));
      }
      if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    } while (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_a8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  p_Var12 = (this->mark_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->mark_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var12 != p_Var2) {
    do {
      std::vector<int,_std::allocator<int>_>::vector
                (&local_118,(vector<int,_std::allocator<int>_> *)(p_Var12 + 1));
      local_100 = *(int *)&p_Var12[1]._M_right;
      if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        piVar11 = local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          if ((this->what_letter_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[*piVar11] == '#') {
            DFA::add_final(__return_storage_ptr__,local_100);
            break;
          }
          piVar11 = piVar11 + 1;
        } while (piVar11 !=
                 local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != p_Var2);
  }
  std::
  deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~deque((deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

DFA RegexToDFAConverter::convert(const string &expr) {
  string simplified_expr = simplify(expr);

  //evaluate expression
  int curr_pos = 0;
  leaves_count_ = 0, follow_pos_.clear(); what_letter_.clear();
  auto syntax_tree_root = expression_eval(simplified_expr, curr_pos);

  auto comp = [&](int a, int b) -> bool {
    return (what_letter_[a] == what_letter_[b] ? a < b : what_letter_[a] < what_letter_[b]);
  };

  //initialize queue with first_pos of all the syntax tree as a starting state
  queue< vector<int> > que;
  que.push(vector<int>());
  for (int it : syntax_tree_root->first_pos)
    que.front().push_back(it);
  sort(que.front().begin(), que.front().end(), comp);

  mark_.clear();
  int num_states = 0;
  DFA res;
  mark_[que.front()] = ++num_states;
  res.add_node(num_states);
  res.set_initial(num_states);
  delete syntax_tree_root;

  while (!que.empty()) {
    auto curr_state = que.front();
    que.pop();

    //for each state generate a next state based on follow_pos and by choosing
    //subsets of positions with same letter

    int i = 0;
    while (i < (int)curr_state.size()) {
      int j = i;
      vector< int > next;
      while (j < (int)curr_state.size() && what_letter_[curr_state[i]] == what_letter_[curr_state[j]]) {
        for (int it : follow_pos_[curr_state[j]])
          next.push_back(it);
        j++;
      }

      //ignore states generated by the end marker
      if (what_letter_[curr_state[i]] == '#') {
        i = j;
        continue;
      }
      sort(next.begin(), next.end());
      next.erase(unique(next.begin(), next.end()), next.end());
      sort(next.begin(), next.end(), comp);

      //add the new state
      if (!mark_[next]) {
        mark_[next] = ++num_states;
        res.add_node(num_states);
        que.push(next);
      }

      //and the corresponding transition
      res.add_transition(mark_[curr_state], what_letter_[curr_state[i]], mark_[next]);
      i = j;
    }
  }

  for (auto it : mark_)
    for (int state : it.first)
      if (what_letter_[state] == '#') {
        res.add_final(it.second);
        break;
      }

  return res;
}